

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O1

int stdin_open(char *filename,int rwmode,int *handle)

{
  int iVar1;
  char *pcVar2;
  
  if (stdin_outfile[0] == '\0') {
    iVar1 = fgetc(_stdin);
    ungetc((int)(char)iVar1,_stdin);
    if ((iVar1 << 0x18 == 0x4b000000) || (iVar1 << 0x18 == 0x1f000000)) {
      iVar1 = mem_compress_stdin_open(filename,rwmode,handle);
      return iVar1;
    }
    if (rwmode != 0) {
      ffpmsg("cannot open stdin with WRITE access");
      return 0x70;
    }
    iVar1 = mem_createmem(0xb40,handle);
    if (iVar1 == 0) {
      iVar1 = stdin2mem(*handle);
      if (iVar1 != 0) {
        ffpmsg("failed to copy stdin into memory (stdin_open)");
        free(memTable[*handle].memaddr);
        return iVar1;
      }
      return 0;
    }
    pcVar2 = "failed to create empty memory file (stdin_open)";
  }
  else {
    iVar1 = file_create(stdin_outfile,handle);
    if (iVar1 == 0) {
      iVar1 = stdin2file(*handle);
      file_close(*handle);
      if (iVar1 == 0) {
        iVar1 = file_open(stdin_outfile,rwmode,handle);
        return iVar1;
      }
      pcVar2 = "failed to copy stdin to file (stdin_open)";
    }
    else {
      pcVar2 = "Unable to create output file to copy stdin (stdin_open):";
    }
    ffpmsg(pcVar2);
    pcVar2 = stdin_outfile;
  }
  ffpmsg(pcVar2);
  return iVar1;
}

Assistant:

int stdin_open(char *filename, int rwmode, int *handle)
/*
  open a FITS file from the stdin file stream by copying it into memory
  The file name is ignored in this case.
*/
{
    int status;
    char cbuff;

    if (*stdin_outfile)
    {
      /* copy the stdin stream to the specified disk file then open the file */

      /* Create the output file */
      status =  file_create(stdin_outfile,handle);

      if (status)
      {
        ffpmsg("Unable to create output file to copy stdin (stdin_open):");
        ffpmsg(stdin_outfile);
        return(status);
      }
 
      /* copy the whole stdin stream to the file */
      status = stdin2file(*handle);
      file_close(*handle);

      if (status)
      {
        ffpmsg("failed to copy stdin to file (stdin_open)");
        ffpmsg(stdin_outfile);
        return(status);
      }

      /* reopen file with proper rwmode attribute */
      status = file_open(stdin_outfile, rwmode, handle);
    }
    else
    {
   
      /* get the first character, then put it back */
      cbuff = fgetc(stdin);
      ungetc(cbuff, stdin);
    
      /* compressed files begin with 037 or 'P' */
      if (cbuff == 31 || cbuff == 75)
      {
         /* looks like the input stream is compressed */
         status = mem_compress_stdin_open(filename, rwmode, handle);
	 
      }
      else
      {
        /* copy the stdin stream into memory then open file in memory */

        if (rwmode != READONLY)
        {
          ffpmsg("cannot open stdin with WRITE access");
          return(READONLY_FILE);
        }

        status = mem_createmem(2880L, handle);

        if (status)
        {
          ffpmsg("failed to create empty memory file (stdin_open)");
          return(status);
        }
 
        /* copy the whole stdin stream into memory */
        status = stdin2mem(*handle);

        if (status)
        {
          ffpmsg("failed to copy stdin into memory (stdin_open)");
          free(memTable[*handle].memaddr);
        }
      }
    }

    return(status);
}